

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall
FIX::Message::Message
          (Message *this,message_order *headerOrder,message_order *trailerOrder,message_order *order
          )

{
  message_order *order_local;
  message_order *trailerOrder_local;
  message_order *headerOrder_local;
  Message *this_local;
  
  FieldMap::FieldMap(&this->super_FieldMap,order);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_00330260;
  Header::Header(&this->m_header,headerOrder);
  Trailer::Trailer(&this->m_trailer,trailerOrder);
  this->m_validStructure = true;
  return;
}

Assistant:

Message::Message(const message_order &headerOrder, const message_order &trailerOrder, const message_order &order)
    : FieldMap(order),
      m_header(headerOrder),
      m_trailer(trailerOrder),
      m_validStructure(true) {}